

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_call_send_data
              (nghttp2_session *session,nghttp2_outbound_item *item,nghttp2_bufs *framebufs)

{
  nghttp2_data_aux_data *aux_data;
  nghttp2_frame *frame;
  size_t length;
  nghttp2_buf *buf;
  int rv;
  nghttp2_bufs *framebufs_local;
  nghttp2_outbound_item *item_local;
  nghttp2_session *session_local;
  
  session_local._4_4_ =
       (*(session->callbacks).send_data_callback)
                 (session,&item->frame,(framebufs->cur->buf).pos,
                  (item->frame).hd.length - (item->frame).data.padlen,
                  (nghttp2_data_source *)&item->aux_data,session->user_data);
  if ((((session_local._4_4_ != -0x20e) && (session_local._4_4_ != -0x209)) &&
      (session_local._4_4_ != -0x1f8)) && (session_local._4_4_ != 0)) {
    session_local._4_4_ = -0x386;
  }
  return session_local._4_4_;
}

Assistant:

static int session_call_send_data(nghttp2_session *session,
                                  nghttp2_outbound_item *item,
                                  nghttp2_bufs *framebufs) {
  int rv;
  nghttp2_buf *buf;
  size_t length;
  nghttp2_frame *frame;
  nghttp2_data_aux_data *aux_data;

  buf = &framebufs->cur->buf;
  frame = &item->frame;
  length = frame->hd.length - frame->data.padlen;
  aux_data = &item->aux_data.data;

  rv = session->callbacks.send_data_callback(session, frame, buf->pos, length,
                                             &aux_data->data_prd.source,
                                             session->user_data);

  switch (rv) {
  case 0:
  case NGHTTP2_ERR_WOULDBLOCK:
  case NGHTTP2_ERR_PAUSE:
  case NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE:
    return rv;
  default:
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }
}